

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcColourRgb::~IfcColourRgb(IfcColourRgb *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  (this->super_IfcColourSpecification).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourSpecification,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x864758;
  *(undefined8 *)&this->field_0x60 = 0x864780;
  puVar2 = *(undefined1 **)
            &(this->super_IfcColourSpecification).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourSpecification,_1UL>.field_0x10;
  puVar1 = &(this->super_IfcColourSpecification).
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourSpecification,_1UL>.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  operator_delete(this,0x78);
  return;
}

Assistant:

IfcColourSpecification() : Object("IfcColourSpecification") {}